

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.hpp
# Opt level: O2

void __thiscall
vkt::pipeline::CoordinateCaptureFragmentShader::CoordinateCaptureFragmentShader
          (CoordinateCaptureFragmentShader *this)

{
  pointer pVVar1;
  
  rr::FragmentShader::FragmentShader(&this->super_FragmentShader,2,1);
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_00bfd318;
  pVVar1 = (this->super_FragmentShader).m_inputs.
           super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  pVVar1->type = GENERICVECTYPE_FLOAT;
  pVVar1[1].type = GENERICVECTYPE_FLOAT;
  ((this->super_FragmentShader).m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  return;
}

Assistant:

CoordinateCaptureFragmentShader (void)
		: rr::FragmentShader(2, 1)
	{
		m_inputs[0].type	= rr::GENERICVECTYPE_FLOAT;
		m_inputs[1].type	= rr::GENERICVECTYPE_FLOAT;
		m_outputs[0].type	= rr::GENERICVECTYPE_FLOAT;
	}